

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

uint32_t spvtools::val::anon_unknown_0::GetMinCoordSize(Op opcode,ImageTypeInfo *info)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  
  if (info->dim == Cube) {
    if (opcode - OpImageRead < 2) {
      return 3;
    }
    if (opcode == OpImageSparseRead) {
      return 3;
    }
  }
  uVar3 = GetPlaneCoordSize(info);
  uVar1 = info->arrayed;
  bVar2 = IsProj(opcode);
  return (uint)bVar2 + uVar3 + uVar1;
}

Assistant:

uint32_t GetMinCoordSize(spv::Op opcode, const ImageTypeInfo& info) {
  if (info.dim == spv::Dim::Cube &&
      (opcode == spv::Op::OpImageRead || opcode == spv::Op::OpImageWrite ||
       opcode == spv::Op::OpImageSparseRead)) {
    // These opcodes use UV for Cube, not direction vector.
    return 3;
  }

  return GetPlaneCoordSize(info) + info.arrayed + (IsProj(opcode) ? 1 : 0);
}